

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

uint16_t invert(uint16_t x,uint16_t q,uint64_t qrecip)

{
  uint16_t uVar1;
  undefined6 in_register_00000032;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = (int)CONCAT62(in_register_00000032,q) - 2;
  uVar3 = 1;
  uVar4 = 1;
  do {
    uVar5 = (uint)x;
    if ((uVar2 & uVar3) != 0) {
      uVar1 = reduce(uVar4 * uVar5,q,qrecip);
      uVar2 = uVar2 & ~uVar3;
      if (uVar2 == 0) {
        return uVar1;
      }
      uVar4 = (uint)uVar1;
    }
    x = reduce(uVar5 * uVar5,q,qrecip);
    uVar3 = uVar3 * 2;
  } while( true );
}

Assistant:

static uint16_t invert(uint16_t x, uint16_t q, uint64_t qrecip)
{
    /* Fermat inversion: compute x^(q-2), since x^(q-1) == 1. */
    uint32_t sq = x, bit = 1, acc = 1, exp = q-2;
    while (1) {
        if (exp & bit) {
            acc = reduce(acc * sq, q, qrecip);
            exp &= ~bit;
            if (!exp)
                return acc;
        }
        sq = reduce(sq * sq, q, qrecip);
        bit <<= 1;
    }
}